

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

int Gia_ManFromIfLogicNode
              (void *pIfMan,Gia_Man_t *pNew,int iObj,Vec_Int_t *vLeaves,Vec_Int_t *vLeavesTemp,
              word *pRes,char *pStr,Vec_Int_t *vCover,Vec_Int_t *vMapping,Vec_Int_t *vMapping2,
              Vec_Int_t *vPacking,int fCheck75,int fCheck44e)

{
  word *pwVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *p;
  int *piVar6;
  word wVar7;
  size_t sVar8;
  Gia_Obj_t *pGVar9;
  ulong uVar10;
  word (*pawVar11) [1024];
  ulong uVar12;
  uint uVar13;
  int iVar14;
  uint i;
  char *__format;
  int iVar15;
  ulong uVar16;
  int nLutRoot;
  long lVar17;
  long lVar18;
  int nLutLeaf;
  word Func0;
  word Func1;
  word t;
  char pLut1 [32];
  word Func2;
  char pLut2 [32];
  
  uVar3 = vLeaves->nSize;
  if (fCheck75 != 0) {
    pStr = "54";
  }
  if (fCheck44e == 0) {
    if (uVar3 == 6 && *(int *)(*(long *)((long)pIfMan + 8) + 0x44) != 0) {
      lVar18 = 0x10;
      p = (Vec_Int_t *)malloc(0x10);
      p->nCap = 0x10;
      p->nSize = 0;
      piVar6 = (int *)malloc(0x40);
      p->pArray = piVar6;
      t = *pRes;
      wVar7 = If_Dec6Perform(t,1);
      If_Dec6Verify(t,wVar7);
      t = (wVar7 & 0xffff) * 0x1000100010001;
      p->nSize = 0;
      do {
        uVar3 = (uint)(wVar7 >> ((byte)lVar18 & 0x3f));
        if (vLeaves->nSize <= (int)(uVar3 & 7)) goto LAB_00210bb6;
        Vec_IntPush(p,vLeaves->pArray[uVar3 & 7]);
        lVar18 = lVar18 + 4;
      } while (lVar18 != 0x20);
      iVar4 = Gia_ManFromIfLogicCreateLut(pNew,&t,p,vCover,vMapping,vMapping2);
      t = (wVar7 >> 0x20 & 0xffff) * 0x1000100010001;
      p->nSize = 0;
      lVar18 = 0x30;
      do {
        uVar3 = (uint)(wVar7 >> ((byte)lVar18 & 0x3f)) & 7;
        iVar15 = iVar4;
        if ((ulong)uVar3 != 7) {
          if (vLeaves->nSize <= (int)uVar3) goto LAB_00210bb6;
          iVar15 = vLeaves->pArray[uVar3];
        }
        Vec_IntPush(p,iVar15);
        lVar18 = lVar18 + 4;
        if (lVar18 == 0x40) {
          iVar4 = Gia_ManFromIfLogicCreateLut(pNew,&t,p,vCover,vMapping,vMapping2);
          if (p->pArray != (int *)0x0) {
            free(p->pArray);
            p->pArray = (int *)0x0;
          }
          free(p);
          return iVar4;
        }
      } while( true );
    }
    if (pStr == (char *)0x0) {
      iVar4 = Gia_ManFromIfLogicCreateLut(pNew,pRes,vLeaves,vCover,vMapping,vMapping2);
      return iVar4;
    }
    sVar8 = strlen(pStr);
    iVar4 = (int)sVar8;
    if (iVar4 - 4U < 0xfffffffe) {
      printf("Wrong LUT struct (%s)\n",pStr);
    }
    else {
      uVar10 = 0;
      do {
        if ((byte)(pStr[uVar10] - 0x37U) < 0xfc) {
          iObj = (int)pStr[uVar10] - 0x30;
          __format = "The LUT size (%d) should belong to {3,4,5,6}.\n";
          goto LAB_00210537;
        }
        uVar10 = uVar10 + 1;
      } while ((sVar8 & 0xffffffff) != uVar10);
      iVar15 = 0;
      if (iVar4 == 3) {
        iVar15 = pStr[1] + -0x30;
      }
      iVar14 = iVar15 + -1;
      if (iVar15 == 0) {
        iVar14 = 0;
      }
      if ((int)uVar3 <= (int)pStr[iVar4 - 1] + iVar14 + *pStr + -0x61) {
        nLutLeaf = *pStr + -0x30;
        nLutRoot = pStr[iVar4 - 1] + -0x30;
        iVar14 = nLutRoot;
        if (nLutRoot < nLutLeaf) {
          iVar14 = nLutLeaf;
        }
        if (iVar14 < iVar15) {
          iVar14 = iVar15;
        }
        if (iVar14 < (int)uVar3) {
          pLut2[0x10] = '\0';
          pLut2[0x11] = '\0';
          pLut2[0x12] = '\0';
          pLut2[0x13] = '\0';
          pLut2[0x14] = '\0';
          pLut2[0x15] = '\0';
          pLut2[0x16] = '\0';
          pLut2[0x17] = '\0';
          pLut2[0x18] = '\0';
          pLut2[0x19] = '\0';
          pLut2[0x1a] = '\0';
          pLut2[0x1b] = '\0';
          pLut2[0x1c] = '\0';
          pLut2[0x1d] = '\0';
          pLut2[0x1e] = '\0';
          pLut2[0x1f] = '\0';
          pLut2[0] = '\0';
          pLut2[1] = '\0';
          pLut2[2] = '\0';
          pLut2[3] = '\0';
          pLut2[4] = '\0';
          pLut2[5] = '\0';
          pLut2[6] = '\0';
          pLut2[7] = '\0';
          pLut2[8] = '\0';
          pLut2[9] = '\0';
          pLut2[10] = '\0';
          pLut2[0xb] = '\0';
          pLut2[0xc] = '\0';
          pLut2[0xd] = '\0';
          pLut2[0xe] = '\0';
          pLut2[0xf] = '\0';
          if (Gia_ManFromIfLogicNode::TruthStore[0][0] == 0) {
            pawVar11 = Gia_ManFromIfLogicNode::TruthStore;
            lVar18 = 0;
            do {
              *(word (**) [1024])((long)Gia_ManFromIfLogicNode::pTruths + lVar18) = pawVar11;
              lVar18 = lVar18 + 8;
              pawVar11 = pawVar11 + 1;
            } while (lVar18 != 0x80);
            lVar18 = 0;
            do {
              wVar7 = Gia_ManFromIfLogicNode::Truth6[lVar18];
              pwVar1 = Gia_ManFromIfLogicNode::pTruths[lVar18];
              lVar17 = 0;
              do {
                pwVar1[lVar17] = wVar7;
                lVar17 = lVar17 + 1;
              } while (lVar17 != 0x400);
              lVar18 = lVar18 + 1;
            } while (lVar18 != 6);
            lVar18 = 6;
            do {
              pwVar1 = Gia_ManFromIfLogicNode::pTruths[lVar18];
              lVar17 = 0;
              do {
                pwVar1[lVar17] = -(ulong)((1 << ((char)lVar18 - 6U & 0x1f) & (uint)lVar17) != 0);
                lVar17 = lVar17 + 1;
              } while (lVar17 != 0x400);
              lVar18 = lVar18 + 1;
            } while (lVar18 != 0x10);
          }
          uVar10 = (ulong)(uint)(1 << ((char)uVar3 - 5U & 0x1f));
          uVar12 = uVar10;
          if ((int)uVar3 < 6) {
            uVar10 = 1;
            uVar12 = uVar10;
          }
          do {
            iVar14 = (int)uVar10;
            if (iVar14 < 1) goto LAB_002107c8;
            lVar18 = uVar10 * 4;
            uVar10 = uVar10 - 1;
          } while (*(int *)((long)pRes + lVar18 + -4) == 0);
          uVar10 = uVar12;
          if (iVar14 < 1) {
LAB_002107c8:
            do {
              iVar4 = (int)uVar12;
              if (iVar4 < 1) break;
              lVar18 = uVar12 * 4;
              uVar12 = uVar12 - 1;
            } while (*(int *)((long)pRes + lVar18 + -4) == -1);
            if (0 < vMapping->nSize) {
              uVar3 = (uint)(iVar4 < 1);
              if (*vMapping->pArray != 0) {
                return uVar3;
              }
              Vec_IntSetEntry(vMapping,0,vMapping2->nSize);
              Vec_IntPush(vMapping2,0);
              Vec_IntPush(vMapping2,0);
              return uVar3;
            }
LAB_00210bb6:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          do {
            iVar14 = (int)uVar10;
            if (iVar14 < 1) goto LAB_002107c8;
            lVar18 = uVar10 * 4;
            uVar10 = uVar10 - 1;
          } while (*(int *)((long)pRes + lVar18 + -4) == -1);
          if (iVar14 < 1) goto LAB_002107c8;
          if (0 < (int)uVar3) {
            uVar10 = 0;
            do {
              uVar16 = uVar12;
              do {
                iVar14 = (int)uVar16;
                if (iVar14 < 1) goto LAB_002108a4;
                lVar18 = uVar16 * 4;
                lVar17 = uVar16 * 4;
                uVar16 = uVar16 - 1;
              } while (*(int *)((long)pRes + lVar18 + -4) ==
                       *(int *)((long)Gia_ManFromIfLogicNode::pTruths[uVar10] + lVar17 + -4));
              uVar16 = uVar12;
              if (iVar14 < 1) {
LAB_002108a4:
                iVar4 = Vec_IntEntry(vLeaves,(int)uVar10);
                return iVar4;
              }
              do {
                iVar14 = (int)uVar16;
                if (iVar14 < 1) goto LAB_002108b3;
                lVar18 = uVar16 * 4;
                lVar17 = uVar16 * 4;
                uVar16 = uVar16 - 1;
              } while ((*(uint *)((long)Gia_ManFromIfLogicNode::pTruths[uVar10] + lVar18 + -4) ^
                       *(uint *)((long)pRes + lVar17 + -4)) == 0xffffffff);
              if (iVar14 < 1) {
LAB_002108b3:
                uVar3 = Vec_IntEntry(vLeaves,(int)uVar10);
                if (-1 < (int)uVar3) {
                  return uVar3 ^ 1;
                }
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                              ,0x131,"int Abc_LitNot(int)");
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 != uVar3);
          }
          if (fCheck75 == 0) {
            if (iVar4 == 2) goto LAB_00210905;
            iVar15 = If_CluCheckExt3(pIfMan,pRes,uVar3,nLutLeaf,iVar15,nLutRoot,(char *)&t,pLut1,
                                     pLut2,&Func0,&Func1,&Func2);
            if (iVar15 != 0) goto LAB_00210990;
            Extra_PrintHex(_stdout,(uint *)pRes,uVar3);
            printf("    ");
LAB_00210b97:
            Kit_DsdPrintFromTruth((uint *)pRes,uVar3);
            putchar(10);
            __format = "Node %d is not decomposable. Deriving LUT structures has failed.\n";
LAB_00210537:
            printf(__format,(ulong)(uint)iObj);
            goto LAB_0021053e;
          }
          if (((7 < (int)uVar3) ||
              (iVar15 = If_CluCheckExt((void *)0x0,pRes,uVar3,4,4,(char *)&t,pLut1,&Func0,&Func1),
              iVar15 == 0)) &&
             (iVar15 = If_CluCheckExt((void *)0x0,pRes,uVar3,5,4,(char *)&t,pLut1,&Func0,&Func1),
             iVar15 == 0)) {
            nLutLeaf = 4;
            nLutRoot = 5;
LAB_00210905:
            iVar15 = If_CluCheckExt((void *)0x0,pRes,uVar3,nLutLeaf,nLutRoot,(char *)&t,pLut1,&Func0
                                    ,&Func1);
            if (iVar15 == 0) {
              Extra_PrintHex(_stdout,(uint *)pRes,uVar3);
              printf("    ");
              goto LAB_00210b97;
            }
          }
LAB_00210990:
          vLeavesTemp->nSize = 0;
          if ('\0' < pLut1[0]) {
            lVar18 = 0;
            do {
              iVar15 = Vec_IntEntry(vLeaves,(int)pLut1[lVar18 + 2]);
              Vec_IntPush(vLeavesTemp,iVar15);
              lVar18 = lVar18 + 1;
            } while (lVar18 < pLut1[0]);
          }
          uVar13 = Gia_ManFromIfLogicCreateLut(pNew,&Func1,vLeavesTemp,vCover,vMapping,vMapping2);
          if ((iVar4 == 3) && ('\0' < pLut2[0])) {
            vLeavesTemp->nSize = 0;
            if ('\0' < pLut2[0]) {
              lVar18 = 0;
              do {
                uVar5 = uVar13;
                if (uVar3 != (int)pLut2[lVar18 + 2]) {
                  uVar5 = Vec_IntEntry(vLeaves,(int)pLut2[lVar18 + 2]);
                }
                Vec_IntPush(vLeavesTemp,uVar5);
                lVar18 = lVar18 + 1;
              } while (lVar18 < pLut2[0]);
            }
            uVar5 = Gia_ManFromIfLogicCreateLut(pNew,&Func2,vLeavesTemp,vCover,vMapping,vMapping2);
            Vec_IntPush(vPacking,3);
            if ((int)uVar13 < 0) goto LAB_00210bd5;
            Vec_IntPush(vPacking,uVar13 >> 1);
            uVar2 = uVar5;
          }
          else {
            Vec_IntPush(vPacking,2);
            uVar5 = uVar13;
            uVar2 = 0xffffffff;
          }
          if ((int)uVar5 < 0) {
LAB_00210bd5:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          Vec_IntPush(vPacking,uVar5 >> 1);
          vLeavesTemp->nSize = 0;
          if ('\0' < (char)t) {
            lVar18 = 0;
            do {
              i = (uint)*(char *)((long)&t + lVar18 + 2);
              uVar5 = uVar13;
              if ((uVar3 != i) && (uVar5 = uVar2, uVar3 + 1 != i)) {
                uVar5 = Vec_IntEntry(vLeaves,i);
              }
              Vec_IntPush(vLeavesTemp,uVar5);
              lVar18 = lVar18 + 1;
            } while (lVar18 < (char)t);
          }
          uVar3 = Gia_ManFromIfLogicCreateLut(pNew,&Func0,vLeavesTemp,vCover,vMapping,vMapping2);
          if ((int)uVar3 < 0) goto LAB_00210bd5;
          uVar13 = uVar3 >> 1;
        }
        else {
          uVar3 = Gia_ManFromIfLogicCreateLut(pNew,pRes,vLeaves,vCover,vMapping,vMapping2);
          if ((int)uVar3 < 0) goto LAB_00210bd5;
          uVar13 = uVar3 >> 1;
          pGVar9 = Gia_ManObj(pNew,uVar13);
          if ((int)uVar3 < 2) {
            return uVar3;
          }
          if (((uint)*(undefined8 *)pGVar9 & 0x9fffffff) == 0x9fffffff) {
            return uVar3;
          }
          Vec_IntPush(vPacking,1);
        }
        Vec_IntPush(vPacking,uVar13);
        if (vPacking->nSize < 1) {
LAB_00210c13:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        piVar6 = vPacking->pArray;
        goto LAB_00210288;
      }
      printf("The node size (%d) is too large for the LUT structure %s.\n",(ulong)uVar3,pStr);
    }
LAB_0021053e:
    uVar3 = 0xffffffff;
  }
  else {
    if (4 < (int)uVar3) {
      iVar4 = Gia_ManFromIfLogicCreateLutSpecial
                        (pNew,pRes,vLeaves,vLeavesTemp,vCover,vMapping,vMapping2,vPacking);
      return iVar4;
    }
    uVar3 = Gia_ManFromIfLogicCreateLut(pNew,pRes,vLeaves,vCover,vMapping,vMapping2);
    if ((int)uVar3 < 0) goto LAB_00210bd5;
    uVar13 = uVar3 >> 1;
    if (pNew->nObjs <= (int)uVar13) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    if ((int)uVar3 < 2) {
      return uVar3;
    }
    if (((uint)*(undefined8 *)(pNew->pObjs + uVar13) & 0x9fffffff) == 0x9fffffff) {
      return uVar3;
    }
    Vec_IntPush(vPacking,1);
    Vec_IntPush(vPacking,uVar13);
    if (vPacking->nSize < 1) goto LAB_00210c13;
    piVar6 = vPacking->pArray;
LAB_00210288:
    *piVar6 = *piVar6 + 1;
  }
  return uVar3;
}

Assistant:

int Gia_ManFromIfLogicNode( void * pIfMan, Gia_Man_t * pNew, int iObj, Vec_Int_t * vLeaves, Vec_Int_t * vLeavesTemp, 
    word * pRes, char * pStr, Vec_Int_t * vCover, Vec_Int_t * vMapping, Vec_Int_t * vMapping2, Vec_Int_t * vPacking, int fCheck75, int fCheck44e )
{
    int nLeaves = Vec_IntSize(vLeaves);
    int i, Length, nLutLeaf, nLutLeaf2, nLutRoot, iObjLit1, iObjLit2, iObjLit3;
    // workaround for the special case
    if ( fCheck75 )
        pStr = "54";
    // perform special case matching for 44
    if ( fCheck44e )
    {
        if ( Vec_IntSize(vLeaves) <= 4 )
        {
            // create mapping
            iObjLit1 = Gia_ManFromIfLogicCreateLut( pNew, pRes, vLeaves, vCover, vMapping, vMapping2 );
            // write packing
            if ( !Gia_ObjIsCi(Gia_ManObj(pNew, Abc_Lit2Var(iObjLit1))) && iObjLit1 > 1 )
            {
                Vec_IntPush( vPacking, 1 );
                Vec_IntPush( vPacking, Abc_Lit2Var(iObjLit1) );
                Vec_IntAddToEntry( vPacking, 0, 1 );
            }
            return iObjLit1;
        }
        return Gia_ManFromIfLogicCreateLutSpecial( pNew, pRes, vLeaves, vLeavesTemp, vCover, vMapping, vMapping2, vPacking );
    }
    if ( ((If_Man_t *)pIfMan)->pPars->fLut6Filter && Vec_IntSize(vLeaves) == 6 )
    {
        extern word If_Dec6Perform( word t, int fDerive );
        extern void If_Dec6Verify( word t, word z );
        Vec_Int_t * vLeaves2 = Vec_IntAlloc( 4 );
        word t = pRes[0];
        word z = If_Dec6Perform( t, 1 );
        //If_DecPrintConfig( z );
        If_Dec6Verify( t, z );

        t = Abc_Tt6Stretch( z & 0xffff, 4 );
        Vec_IntClear( vLeaves2 );
        for ( i = 0; i < 4; i++ )
            Vec_IntPush( vLeaves2, Vec_IntEntry( vLeaves, (int)((z >> (16+i*4)) & 7) ) );
        iObjLit1 = Gia_ManFromIfLogicCreateLut( pNew, &t, vLeaves2, vCover, vMapping, vMapping2 );

        t = Abc_Tt6Stretch( (z >> 32) & 0xffff, 4 );
        Vec_IntClear( vLeaves2 );
        for ( i = 0; i < 4; i++ )
            if ( ((z >> (48+i*4)) & 7) == 7 )
                Vec_IntPush( vLeaves2, iObjLit1 );
            else
                Vec_IntPush( vLeaves2, Vec_IntEntry( vLeaves, (int)((z >> (48+i*4)) & 7) ) );
        iObjLit1 = Gia_ManFromIfLogicCreateLut( pNew, &t, vLeaves2, vCover, vMapping, vMapping2 );

        Vec_IntFree( vLeaves2 );
        return iObjLit1;
    }
    // check if there is no LUT structures
    if ( pStr == NULL )
        return Gia_ManFromIfLogicCreateLut( pNew, pRes, vLeaves, vCover, vMapping, vMapping2 );
    // quit if parameters are wrong
    Length = strlen(pStr);
    if ( Length != 2 && Length != 3 )
    {
        printf( "Wrong LUT struct (%s)\n", pStr );
        return -1;
    }
    for ( i = 0; i < Length; i++ )
        if ( pStr[i] - '0' < 3 || pStr[i] - '0' > 6 )
        {
            printf( "The LUT size (%d) should belong to {3,4,5,6}.\n", pStr[i] - '0' );
            return -1;
        }

    nLutLeaf  =                   pStr[0] - '0';
    nLutLeaf2 = ( Length == 3 ) ? pStr[1] - '0' : 0;
    nLutRoot  =                   pStr[Length-1] - '0';
    if ( nLeaves > nLutLeaf - 1 + (nLutLeaf2 ? nLutLeaf2 - 1 : 0) + nLutRoot )
    {
        printf( "The node size (%d) is too large for the LUT structure %s.\n", nLeaves, pStr );
        return -1;
    }

    // consider easy case
    if ( nLeaves <= Abc_MaxInt( nLutLeaf2, Abc_MaxInt(nLutLeaf, nLutRoot) ) )
    {
        // create mapping
        iObjLit1 = Gia_ManFromIfLogicCreateLut( pNew, pRes, vLeaves, vCover, vMapping, vMapping2 );
        // write packing
        if ( !Gia_ObjIsCi(Gia_ManObj(pNew, Abc_Lit2Var(iObjLit1))) && iObjLit1 > 1 )
        {
            Vec_IntPush( vPacking, 1 );
            Vec_IntPush( vPacking, Abc_Lit2Var(iObjLit1) );
            Vec_IntAddToEntry( vPacking, 0, 1 );
        }
        return iObjLit1;
    }
    else
    {
        extern int If_CluMinimumBase( word * t, int * pSupp, int nVarsAll, int * pnVars );

        static word TruthStore[16][1<<10] = {{0}}, * pTruths[16];
        word Func0, Func1, Func2;
        char pLut0[32], pLut1[32], pLut2[32] = {0};

        if ( TruthStore[0][0] == 0 )
        {
            static word Truth6[6] = {
                0xAAAAAAAAAAAAAAAA,
                0xCCCCCCCCCCCCCCCC,
                0xF0F0F0F0F0F0F0F0,
                0xFF00FF00FF00FF00,
                0xFFFF0000FFFF0000,
                0xFFFFFFFF00000000
            };
            int nVarsMax = 16;
            int nWordsMax = (1 << 10);
            int i, k;
            assert( nVarsMax <= 16 );
            for ( i = 0; i < nVarsMax; i++ )
                pTruths[i] = TruthStore[i];
            for ( i = 0; i < 6; i++ )
                for ( k = 0; k < nWordsMax; k++ )
                    pTruths[i][k] = Truth6[i];
            for ( i = 6; i < nVarsMax; i++ )
                for ( k = 0; k < nWordsMax; k++ )
                    pTruths[i][k] = ((k >> (i-6)) & 1) ? ~(word)0 : 0;
        }
        // derive truth table
        if ( Kit_TruthIsConst0((unsigned *)pRes, nLeaves) || Kit_TruthIsConst1((unsigned *)pRes, nLeaves) )
        {
//            fprintf( pFile, ".names %s\n %d\n", Abc_ObjName(Abc_ObjFanout0(pObj)), Kit_TruthIsConst1((unsigned *)pRes, nLeaves) );
            iObjLit1 = Abc_LitNotCond( 0, Kit_TruthIsConst1((unsigned *)pRes, nLeaves) );
            // write mapping
            if ( Vec_IntEntry(vMapping, 0) == 0 )
            {
                Vec_IntSetEntry( vMapping, 0, Vec_IntSize(vMapping2) );
                Vec_IntPush( vMapping2, 0 );
                Vec_IntPush( vMapping2, 0 );
            }
            return iObjLit1;
        }
        // check for elementary truth table
        for ( i = 0; i < nLeaves; i++ )
        {
            if ( Kit_TruthIsEqual((unsigned *)pRes, (unsigned *)pTruths[i], nLeaves) )
                return Vec_IntEntry(vLeaves, i);
            if ( Kit_TruthIsOpposite((unsigned *)pRes, (unsigned *)pTruths[i], nLeaves) )
                return Abc_LitNot(Vec_IntEntry(vLeaves, i));
        }

        // perform decomposition
        if ( fCheck75 ) 
        {
//            if ( nLeaves < 8 && If_CutPerformCheck16( p, (unsigned *)pTruth, nVars, nLeaves, "44" ) )
            if ( nLeaves < 8 && If_CluCheckExt( NULL, pRes, nLeaves, 4, 4, pLut0, pLut1, &Func0, &Func1 ) )
            {
                nLutLeaf = 4;
                nLutRoot = 4;
            }
//            if ( If_CutPerformCheck45( p, (unsigned *)pTruth, nVars, nLeaves, pStr ) )
            else if ( If_CluCheckExt( NULL, pRes, nLeaves, 5, 4, pLut0, pLut1, &Func0, &Func1 ) )
            {
                nLutLeaf = 5;
                nLutRoot = 4;
            }
//            if ( If_CutPerformCheck54( p, (unsigned *)pTruth, nVars, nLeaves, pStr ) )
            else if ( If_CluCheckExt( NULL, pRes, nLeaves, 4, 5, pLut0, pLut1, &Func0, &Func1 ) )
            {
                nLutLeaf = 4;
                nLutRoot = 5;
            }
            else
            {
                Extra_PrintHex( stdout, (unsigned *)pRes, nLeaves );  printf( "    " );
                Kit_DsdPrintFromTruth( (unsigned*)pRes, nLeaves );  printf( "\n" );
                printf( "Node %d is not decomposable. Deriving LUT structures has failed.\n", iObj );
                return -1;
            }
        }
        else
        {
            if ( Length == 2 )
            {
                if ( !If_CluCheckExt( NULL, pRes, nLeaves, nLutLeaf, nLutRoot, pLut0, pLut1, &Func0, &Func1 ) )
                {
                    Extra_PrintHex( stdout, (unsigned *)pRes, nLeaves );  printf( "    " );
                    Kit_DsdPrintFromTruth( (unsigned*)pRes, nLeaves );  printf( "\n" );
                    printf( "Node %d is not decomposable. Deriving LUT structures has failed.\n", iObj );
                    return -1;
                }
            }
            else
            {
                if ( !If_CluCheckExt3( pIfMan, pRes, nLeaves, nLutLeaf, nLutLeaf2, nLutRoot, pLut0, pLut1, pLut2, &Func0, &Func1, &Func2 ) )
                {
                    Extra_PrintHex( stdout, (unsigned *)pRes, nLeaves );  printf( "    " );
                    Kit_DsdPrintFromTruth( (unsigned*)pRes, nLeaves );  printf( "\n" );
                    printf( "Node %d is not decomposable. Deriving LUT structures has failed.\n", iObj );
                    return -1;
                }
            }
        }

/*
        // write leaf node
        Id = Abc2_NtkAllocObj( pNew, pLut1[0], Abc2_ObjType(pObj) );
        iObjLit1 = Abc_Var2Lit( Id, 0 );
        pObjNew = Abc2_NtkObj( pNew, Id );
        for ( i = 0; i < pLut1[0]; i++ )
            Abc2_ObjSetFaninLit( pObjNew, i, Abc2_ObjFaninCopy(pObj, pLut1[2+i]) );
        Abc2_ObjSetTruth( pObjNew, Func1 );
*/
        // write leaf node
        Vec_IntClear( vLeavesTemp );
        for ( i = 0; i < pLut1[0]; i++ )
            Vec_IntPush( vLeavesTemp, Vec_IntEntry(vLeaves, pLut1[2+i]) );
        iObjLit1 = Gia_ManFromIfLogicCreateLut( pNew, &Func1, vLeavesTemp, vCover, vMapping, vMapping2 );

        if ( Length == 3 && pLut2[0] > 0 )
        {
        /*
            Id = Abc2_NtkAllocObj( pNew, pLut2[0], Abc2_ObjType(pObj) );
            iObjLit2 = Abc_Var2Lit( Id, 0 );
            pObjNew = Abc2_NtkObj( pNew, Id );
            for ( i = 0; i < pLut2[0]; i++ )
                if ( pLut2[2+i] == nLeaves )
                    Abc2_ObjSetFaninLit( pObjNew, i, iObjLit1 );
                else
                    Abc2_ObjSetFaninLit( pObjNew, i, Abc2_ObjFaninCopy(pObj, pLut2[2+i]) );
            Abc2_ObjSetTruth( pObjNew, Func2 );
        */

            // write leaf node
            Vec_IntClear( vLeavesTemp );
            for ( i = 0; i < pLut2[0]; i++ )
                if ( pLut2[2+i] == nLeaves )
                    Vec_IntPush( vLeavesTemp, iObjLit1 );
                else
                    Vec_IntPush( vLeavesTemp, Vec_IntEntry(vLeaves, pLut2[2+i]) );
            iObjLit2 = Gia_ManFromIfLogicCreateLut( pNew, &Func2, vLeavesTemp, vCover, vMapping, vMapping2 );

            // write packing
            Vec_IntPush( vPacking, 3 );
            Vec_IntPush( vPacking, Abc_Lit2Var(iObjLit1) );
            Vec_IntPush( vPacking, Abc_Lit2Var(iObjLit2) );
        }
        else
        {
            // write packing
            Vec_IntPush( vPacking, 2 );
            Vec_IntPush( vPacking, Abc_Lit2Var(iObjLit1) );
            iObjLit2 = -1;
        }
/*
        // write root node
        Id = Abc2_NtkAllocObj( pNew, pLut0[0], Abc2_ObjType(pObj) );
        iObjLit3 = Abc_Var2Lit( Id, 0 );
        pObjNew = Abc2_NtkObj( pNew, Id );
        for ( i = 0; i < pLut0[0]; i++ )
            if ( pLut0[2+i] == nLeaves )
                Abc2_ObjSetFaninLit( pObjNew, i, iObjLit1 );
            else if ( pLut0[2+i] == nLeaves+1 )
                Abc2_ObjSetFaninLit( pObjNew, i, iObjLit2 );
            else
                Abc2_ObjSetFaninLit( pObjNew, i, Abc2_ObjFaninCopy(pObj, pLut0[2+i]) );
        Abc2_ObjSetTruth( pObjNew, Func0 );
        Abc2_ObjSetCopy( pObj, iObjLit3 );
*/
        // write root node
        Vec_IntClear( vLeavesTemp );
        for ( i = 0; i < pLut0[0]; i++ )
            if ( pLut0[2+i] == nLeaves )
                Vec_IntPush( vLeavesTemp, iObjLit1 );
            else if ( pLut0[2+i] == nLeaves+1 )
                Vec_IntPush( vLeavesTemp, iObjLit2 );
            else
                Vec_IntPush( vLeavesTemp, Vec_IntEntry(vLeaves, pLut0[2+i]) );
        iObjLit3 = Gia_ManFromIfLogicCreateLut( pNew, &Func0, vLeavesTemp, vCover, vMapping, vMapping2 );

        // write packing
        Vec_IntPush( vPacking, Abc_Lit2Var(iObjLit3) );
        Vec_IntAddToEntry( vPacking, 0, 1 );
    }
    return iObjLit3;
}